

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::init_frame(jpeg_decoder *this)

{
  uint uVar1;
  sbyte sVar2;
  int iVar3;
  int iVar4;
  uint8 *puVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  if (this->m_comps_in_frame != 3) {
    if (this->m_comps_in_frame != 1) {
      stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
    }
    if ((this->m_comp_h_samp[0] == 1) && (this->m_comp_v_samp[0] == 1)) {
      iVar8 = 0;
      iVar10 = 8;
      iVar3 = 1;
      iVar4 = 8;
      goto LAB_001513d9;
    }
LAB_00151554:
    stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
  }
  if ((((this->m_comp_h_samp[1] != 1) || (this->m_comp_v_samp[1] != 1)) ||
      (this->m_comp_h_samp[2] != 1)) || (this->m_comp_v_samp[2] != 1)) goto LAB_00151554;
  uVar9 = this->m_comp_h_samp[0];
  uVar1 = this->m_comp_v_samp[0];
  iVar4 = 8;
  if ((uVar9 ^ 1) == 0 && (uVar1 ^ 1) == 0) {
    iVar8 = 1;
    iVar3 = 3;
  }
  else {
    iVar3 = 4;
    if (uVar9 == 2 && (uVar1 ^ 1) == 0) {
      iVar10 = 0x10;
      iVar8 = 2;
      goto LAB_001513d9;
    }
    if ((uVar9 ^ 1) != 0 || uVar1 != 2) {
      if ((uVar9 != 2) || (uVar1 != 2)) goto LAB_00151554;
      iVar10 = 0x10;
      iVar3 = 6;
      iVar8 = 4;
      iVar4 = 0x10;
      goto LAB_001513d9;
    }
    iVar4 = 0x10;
    iVar8 = 3;
    iVar3 = 4;
  }
  iVar10 = 8;
LAB_001513d9:
  this->m_scan_type = iVar8;
  this->m_max_blocks_per_mcu = iVar3;
  this->m_max_mcu_x_size = iVar10;
  this->m_max_mcu_y_size = iVar4;
  iVar3 = this->m_image_x_size;
  this->m_max_mcus_per_row = (iVar3 + iVar10 + -1) / iVar10;
  sVar2 = (iVar8 != 0) * '\x02';
  uVar9 = (iVar3 + 0xfU & 0xfff0) << sVar2;
  this->m_max_mcus_per_col = (this->m_image_y_size + iVar4 + -1) / iVar4;
  this->m_dest_bytes_per_pixel = (uint)(iVar8 != 0) * 3 + 1;
  this->m_dest_bytes_per_scan_line = uVar9;
  this->m_real_dest_bytes_per_scan_line = iVar3 << sVar2;
  puVar5 = (uint8 *)alloc(this,(ulong)uVar9,false);
  this->m_pScan_line_0 = puVar5;
  if (this->m_scan_type - 3U < 2) {
    puVar5 = (uint8 *)alloc(this,(long)this->m_dest_bytes_per_scan_line,false);
    this->m_pScan_line_1 = puVar5;
  }
  iVar4 = this->m_max_mcus_per_row * this->m_max_blocks_per_mcu;
  this->m_max_blocks_per_row = iVar4;
  if (iVar4 < 0x4001) {
    pvVar6 = alloc(this,(long)this->m_max_blocks_per_mcu << 7 | 0xf,false);
    this->m_pMCU_coefficients = (jpgd_block_coeff_t *)((long)pvVar6 + 0xfU & 0xfffffffffffffff0);
    iVar4 = this->m_max_blocks_per_mcu;
    if (0 < (long)iVar4) {
      lVar7 = 0;
      do {
        this->m_mcu_block_max_zag[lVar7] = 0x40;
        lVar7 = lVar7 + 1;
      } while (iVar4 != lVar7);
    }
    pvVar6 = alloc(this,(long)this->m_max_blocks_per_row << 6 | 0xf,false);
    this->m_pSample_buf = (uint8 *)((long)pvVar6 + 0xfU & 0xfffffffffffffff0);
    pvVar6 = alloc(this,(long)this->m_max_blocks_per_row << 6 | 0xf,false);
    this->m_pSample_buf_prev = (uint8 *)((long)pvVar6 + 0xfU & 0xfffffffffffffff0);
    this->m_total_lines_left = this->m_image_y_size;
    this->m_mcu_lines_left = 0;
    create_look_ups(this);
    return;
  }
  stop_decoding(this,JPGD_DECODE_ERROR);
}

Assistant:

void jpeg_decoder::init_frame()
	{
		int i;

		if (m_comps_in_frame == 1)
		{
			if ((m_comp_h_samp[0] != 1) || (m_comp_v_samp[0] != 1))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			m_scan_type = JPGD_GRAYSCALE;
			m_max_blocks_per_mcu = 1;
			m_max_mcu_x_size = 8;
			m_max_mcu_y_size = 8;
		}
		else if (m_comps_in_frame == 3)
		{
			if (((m_comp_h_samp[1] != 1) || (m_comp_v_samp[1] != 1)) ||
				((m_comp_h_samp[2] != 1) || (m_comp_v_samp[2] != 1)))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1))
			{
				m_scan_type = JPGD_YH1V1;

				m_max_blocks_per_mcu = 3;
				m_max_mcu_x_size = 8;
				m_max_mcu_y_size = 8;
			}
			else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1))
			{
				m_scan_type = JPGD_YH2V1;
				m_max_blocks_per_mcu = 4;
				m_max_mcu_x_size = 16;
				m_max_mcu_y_size = 8;
			}
			else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 2))
			{
				m_scan_type = JPGD_YH1V2;
				m_max_blocks_per_mcu = 4;
				m_max_mcu_x_size = 8;
				m_max_mcu_y_size = 16;
			}
			else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2))
			{
				m_scan_type = JPGD_YH2V2;
				m_max_blocks_per_mcu = 6;
				m_max_mcu_x_size = 16;
				m_max_mcu_y_size = 16;
			}
			else
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);
		}
		else
			stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

		m_max_mcus_per_row = (m_image_x_size + (m_max_mcu_x_size - 1)) / m_max_mcu_x_size;
		m_max_mcus_per_col = (m_image_y_size + (m_max_mcu_y_size - 1)) / m_max_mcu_y_size;

		// These values are for the *destination* pixels: after conversion.
		if (m_scan_type == JPGD_GRAYSCALE)
			m_dest_bytes_per_pixel = 1;
		else
			m_dest_bytes_per_pixel = 4;

		m_dest_bytes_per_scan_line = ((m_image_x_size + 15) & 0xFFF0) * m_dest_bytes_per_pixel;

		m_real_dest_bytes_per_scan_line = (m_image_x_size * m_dest_bytes_per_pixel);

		// Initialize two scan line buffers.
		m_pScan_line_0 = (uint8*)alloc_aligned(m_dest_bytes_per_scan_line, true);
		if ((m_scan_type == JPGD_YH1V2) || (m_scan_type == JPGD_YH2V2))
			m_pScan_line_1 = (uint8*)alloc_aligned(m_dest_bytes_per_scan_line, true);

		m_max_blocks_per_row = m_max_mcus_per_row * m_max_blocks_per_mcu;

		// Should never happen
		if (m_max_blocks_per_row > JPGD_MAX_BLOCKS_PER_ROW)
			stop_decoding(JPGD_DECODE_ERROR);

		// Allocate the coefficient buffer, enough for one MCU
		m_pMCU_coefficients = (jpgd_block_coeff_t *)alloc_aligned(m_max_blocks_per_mcu * 64 * sizeof(jpgd_block_coeff_t));
				
		for (i = 0; i < m_max_blocks_per_mcu; i++)
			m_mcu_block_max_zag[i] = 64;

		m_pSample_buf = (uint8*)alloc_aligned(m_max_blocks_per_row * 64);
		m_pSample_buf_prev = (uint8*)alloc_aligned(m_max_blocks_per_row * 64);

		m_total_lines_left = m_image_y_size;

		m_mcu_lines_left = 0;

		create_look_ups();
	}